

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmPageSettings::Read(ON_3dmPageSettings *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_29;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_3dmPageSettings *this_local;
  
  iStack_24 = 0;
  local_28 = 0;
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&stack0xffffffffffffffdc,&local_28)
  ;
  if (bVar1) {
    local_29 = iStack_24 == 1;
    if (((((local_29) &&
          (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_page_number), local_29)) &&
         (local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_width_mm), local_29)) &&
        ((local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_height_mm), local_29 &&
         (local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_left_margin_mm), local_29)
         ))) && ((local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_right_margin_mm),
                 local_29 &&
                 ((local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_top_margin_mm),
                  local_29 &&
                  (local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_bottom_margin_mm)
                  , local_29)))))) {
      local_29 = ON_BinaryArchive::ReadString(_minor_version,&this->m_printer_name);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = false;
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmPageSettings::Read(ON_BinaryArchive& archive)
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadInt(&m_page_number );
    if (!rc) break;

    rc = archive.ReadDouble(&m_width_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_height_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_left_margin_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_right_margin_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_top_margin_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_bottom_margin_mm);
    if ( !rc) break;

    rc = archive.ReadString(m_printer_name);
    if (!rc) break;

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}